

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

Error efsw::Errors::Log::createLastError(Error err,string *log)

{
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *log_local;
  Error err_local;
  
  local_18 = log;
  log_local._4_4_ = err;
  switch(err) {
  case Unspecified:
  default:
    std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)log);
    break;
  case WatcherFailed:
    std::operator+((char *)local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "File system watcher failed ( ");
    std::operator+(local_148,(char *)local_168);
    std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)local_148);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string(local_168);
    break;
  case FileRemote:
    std::operator+((char *)local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "File is located in a remote file system, use a generic watcher. ( ");
    std::operator+(local_108,(char *)local_128);
    std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string(local_128);
    break;
  case FileOutOfScope:
    std::operator+((char *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Symlink file out of scope ( ");
    std::operator+(local_c8,(char *)local_e8);
    std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string(local_e8);
    break;
  case FileRepeated:
    std::operator+((char *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "File repeated in watches ( ");
    std::operator+(local_88,(char *)local_a8);
    std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string(local_a8);
    break;
  case FileNotFound:
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "File not found ( ");
    std::operator+(local_38,(char *)local_58);
    std::__cxx11::string::operator=((string *)LastError_abi_cxx11_,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_58);
  }
  return log_local._4_4_;
}

Assistant:

Error Log::createLastError( Error err, std::string log ) {
	switch ( err ) {
		case FileNotFound:
			LastError = "File not found ( " + log + " )";
			break;
		case FileRepeated:
			LastError = "File repeated in watches ( " + log + " )";
			break;
		case FileOutOfScope:
			LastError = "Symlink file out of scope ( " + log + " )";
			break;
		case FileRemote:
			LastError =
				"File is located in a remote file system, use a generic watcher. ( " + log + " )";
			break;
		case WatcherFailed:
			LastError = "File system watcher failed ( " + log + " )";
			break;
		case Unspecified:
		default:
			LastError = log;
	}

	efDEBUG( "%s\n", LastError.c_str() );
	return err;
}